

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgemm.cpp
# Opt level: O2

void __thiscall
(anonymous_namespace)::tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float>::gemm<3,2>
          (tinyBLAS_Q0_AVX<block_q4_0,block_q8_0,float> *this,int64_t m0,int64_t m,int64_t n0,
          int64_t n)

{
  float *pfVar1;
  float *pfVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  undefined8 *puVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [16];
  __m256 Cv [2] [3];
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  
  auVar14[8] = 0xf;
  auVar14._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar14[9] = 0xf;
  auVar14[10] = 0xf;
  auVar14[0xb] = 0xf;
  auVar14[0xc] = 0xf;
  auVar14[0xd] = 0xf;
  auVar14[0xe] = 0xf;
  auVar14[0xf] = 0xf;
  auVar14[0x10] = 0xf;
  auVar14[0x11] = 0xf;
  auVar14[0x12] = 0xf;
  auVar14[0x13] = 0xf;
  auVar14[0x14] = 0xf;
  auVar14[0x15] = 0xf;
  auVar14[0x16] = 0xf;
  auVar14[0x17] = 0xf;
  auVar14[0x18] = 0xf;
  auVar14[0x19] = 0xf;
  auVar14[0x1a] = 0xf;
  auVar14[0x1b] = 0xf;
  auVar14[0x1c] = 0xf;
  auVar14[0x1d] = 0xf;
  auVar14[0x1e] = 0xf;
  auVar14[0x1f] = 0xf;
  auVar15[8] = 0xf8;
  auVar15._0_8_ = 0xf8f8f8f8f8f8f8f8;
  auVar15[9] = 0xf8;
  auVar15[10] = 0xf8;
  auVar15[0xb] = 0xf8;
  auVar15[0xc] = 0xf8;
  auVar15[0xd] = 0xf8;
  auVar15[0xe] = 0xf8;
  auVar15[0xf] = 0xf8;
  auVar15[0x10] = 0xf8;
  auVar15[0x11] = 0xf8;
  auVar15[0x12] = 0xf8;
  auVar15[0x13] = 0xf8;
  auVar15[0x14] = 0xf8;
  auVar15[0x15] = 0xf8;
  auVar15[0x16] = 0xf8;
  auVar15[0x17] = 0xf8;
  auVar15[0x18] = 0xf8;
  auVar15[0x19] = 0xf8;
  auVar15[0x1a] = 0xf8;
  auVar15[0x1b] = 0xf8;
  auVar15[0x1c] = 0xf8;
  auVar15[0x1d] = 0xf8;
  auVar15[0x1e] = 0xf8;
  auVar15[0x1f] = 0xf8;
  lVar6 = (n - n0) / 2;
  lVar13 = ((m - m0) / 3) * lVar6;
  lVar7 = (lVar13 + -1 + (long)*(int *)(this + 0x3c)) / (long)*(int *)(this + 0x3c);
  uVar4 = *(ulong *)(this + 0x18);
  lVar5 = *(long *)(this + 0x30);
  lVar10 = *(int *)(this + 0x38) * lVar7;
  lVar7 = lVar7 + lVar10;
  if (lVar13 <= lVar7) {
    lVar7 = lVar13;
  }
  lVar13 = *(long *)(this + 0x10);
  while( true ) {
    if (lVar7 <= lVar10) {
      return;
    }
    local_c0 = 0;
    uStack_b8 = 0;
    uStack_b0 = 0;
    uStack_a8 = 0;
    uStack_a0 = 0;
    uStack_98 = 0;
    uStack_90 = 0;
    uStack_88 = 0;
    local_100 = 0;
    uStack_f8 = 0;
    uStack_f0 = 0;
    uStack_e8 = 0;
    uStack_e0 = 0;
    uStack_d8 = 0;
    uStack_d0 = 0;
    uStack_c8 = 0;
    local_140 = 0;
    uStack_138 = 0;
    uStack_130 = 0;
    uStack_128 = 0;
    uStack_120 = 0;
    uStack_118 = 0;
    uStack_110 = 0;
    uStack_108 = 0;
    lVar8 = n0 + (lVar10 % lVar6) * 2;
    if ((~((long)uVar4 >> 0x3f) & uVar4) != 0) break;
    puVar9 = &local_140;
    lVar8 = (lVar10 / lVar6) * 0xc + lVar8 * lVar5 * 4 + m0 * 4 + lVar13;
    for (lVar11 = 0; lVar11 != 2; lVar11 = lVar11 + 1) {
      for (lVar12 = 0; lVar12 != 0xc; lVar12 = lVar12 + 4) {
        pfVar2 = (float *)(puVar9 + lVar12 + 2);
        pfVar1 = (float *)(puVar9 + lVar12);
        auVar18._0_4_ = *pfVar2 + *pfVar1;
        auVar18._4_4_ = pfVar2[1] + pfVar1[1];
        auVar18._8_4_ = pfVar2[2] + pfVar1[2];
        auVar18._12_4_ = pfVar2[3] + pfVar1[3];
        auVar3 = vshufpd_avx(auVar18,auVar18,1);
        auVar16._0_4_ = auVar18._0_4_ + auVar3._0_4_;
        auVar16._4_4_ = auVar18._4_4_ + auVar3._4_4_;
        auVar16._8_4_ = auVar18._8_4_ + auVar3._8_4_;
        auVar16._12_4_ = auVar18._12_4_ + auVar3._12_4_;
        auVar3 = vhaddps_avx(auVar16,auVar16);
        *(int *)(lVar8 + lVar12) = auVar3._0_4_;
      }
      lVar8 = lVar8 + lVar5 * 4;
      puVar9 = puVar9 + 0xc;
    }
    lVar10 = lVar10 + 1;
  }
  auVar3 = *(undefined1 (*) [16])
            (*(long *)this + 2 + ((lVar10 / lVar6) * 3 + m0) * *(long *)(this + 0x20) * 0x12);
  auVar18 = vpsrlw_avx(auVar3,4);
  auVar17._0_16_ = ZEXT116(0) * auVar18 + ZEXT116(1) * auVar3;
  auVar17._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar18;
  auVar14 = vpand_avx2(auVar17,auVar14);
  auVar14 = vpaddb_avx2(auVar14,auVar15);
  vpsignb_avx2(auVar14,auVar14);
  vpsignb_avx2(*(undefined1 (*) [32])
                (*(long *)(this + 8) + 2 + lVar8 * *(long *)(this + 0x28) * 0x22),auVar14);
  halt_baddata();
}

Assistant:

NOINLINE void gemm(int64_t m0, int64_t m, int64_t n0, int64_t n) {
        int64_t ytiles = (m - m0) / RM;
        int64_t xtiles = (n - n0) / RN;
        int64_t tiles = xtiles * ytiles;
        int64_t duty = (tiles + nth - 1) / nth;
        int64_t start = duty * ith;
        int64_t end = start + duty;
        if (end > tiles)
            end = tiles;
        for (int64_t job = start; job < end; ++job) {
            int64_t ii = m0 + job / xtiles * RM;
            int64_t jj = n0 + job % xtiles * RN;
            __m256 Cv[RN][RM] = {};
            for (int64_t l = 0; l < k; ++l)
                for (int64_t j = 0; j < RN; ++j)
                    for (int64_t i = 0; i < RM; ++i) {
#if defined(__AVX2__)
                        __m256 udTmp = updot(_mm256_sign_epi8(load(A + lda * (ii + i) + l),
                                                              load(A + lda * (ii + i) + l)),
                                             _mm256_sign_epi8(load(B + ldb * (jj + j) + l),
                                                              load(A + lda * (ii + i) + l)));
#else
                        __m128i ali0 = load0(A + lda * (ii + i) + l);
                        __m128i ali1 = load1(A + lda * (ii + i) + l);
                        __m128i blj0 = load0(B + ldb * (jj + j) + l);
                        __m128i blj1 = load1(B + ldb * (jj + j) + l);

                        __m128i sepAA0 = _mm_sign_epi8(ali0, ali0);
                        __m128i sepAA1 = _mm_sign_epi8(ali1, ali1);
                        __m128i sepBA0 = _mm_sign_epi8(blj0, ali0);
                        __m128i sepBA1 = _mm_sign_epi8(blj1, ali1);

                        // updot
                        const __m128i oneFill = _mm_set1_epi16(1);
                        __m128i mad0 = _mm_maddubs_epi16(sepAA0, sepBA0);
                        __m128i mad1 = _mm_maddubs_epi16(sepAA1, sepBA1);
                        __m256 udTmp = _mm256_cvtepi32_ps(MM256_SET_M128I(_mm_madd_epi16(oneFill, mad1), _mm_madd_epi16(oneFill, mad0)));
#endif
                        Cv[j][i] = madd(_mm256_set1_ps(unhalf(A[lda * (ii + i) + l].d) *
                                                       unhalf(B[ldb * (jj + j) + l].d)),
                                                       udTmp,
                                                       Cv[j][i]);
                    }
            for (int64_t j = 0; j < RN; ++j)
                for (int64_t i = 0; i < RM; ++i)
                    C[ldc * (jj + j) + (ii + i)] = hsum(Cv[j][i]);
        }
    }